

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O0

int ZXing::OneD::ComputeChecksumIndex(string *contents,int maxWeight)

{
  int iVar1;
  int in_ESI;
  ulong in_RDI;
  int indexInString;
  int i;
  int total;
  int weight;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_18;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  iVar2 = 0;
  local_18 = Size<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  while (local_18 = local_18 + -1, -1 < local_18) {
    std::__cxx11::string::operator[](in_RDI);
    iVar1 = IndexOf((char *)CONCAT44(in_ESI,iVar3),(char)((uint)iVar2 >> 0x18));
    iVar2 = iVar1 * iVar3 + iVar2;
    iVar3 = iVar3 + 1;
    if (in_ESI < iVar3) {
      iVar3 = 1;
    }
  }
  return iVar2 % 0x2f;
}

Assistant:

static int ComputeChecksumIndex(const std::string& contents, int maxWeight)
{
	int weight = 1;
	int total = 0;

	for (int i = Size(contents) - 1; i >= 0; i--) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		total += indexInString * weight;
		if (++weight > maxWeight) {
			weight = 1;
		}
	}
	return total % 47;
}